

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *node)

{
  ImVec2 *this;
  ImVec2 *this_00;
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiAxis axis;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ImDrawList *this_01;
  ImGuiDockNode *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  uint uVar8;
  ImU32 col;
  ImGuiID IVar9;
  float *pfVar10;
  ImGuiDockNode **ppIVar11;
  int side_n;
  long lVar12;
  int touching_node_n_1;
  size_t idx;
  int touching_node_n;
  int iVar13;
  float fVar14;
  float local_b8;
  float cur_size_1;
  ImGuiContext *local_a8;
  float local_9c;
  float cur_size_0;
  undefined1 auStack_94 [12];
  ImVec2 IStack_90;
  ImVector<ImGuiDockNode_*> touching_nodes [2];
  ImRect local_40;
  
  node_00 = node->ChildNodes[0];
  if (node_00 == (ImGuiDockNode *)0x0) {
    return;
  }
  node_01 = node->ChildNodes[1];
  if ((node_00->field_0xbd & 2) != 0) {
    if ((node_01->field_0xbd & 2) != 0) {
      axis = node->SplitAxis;
      idx = (size_t)axis;
      if (idx == 0xffffffffffffffff) {
        __assert_fail("axis != ImGuiAxis_None",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x3b29,"void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *)");
      }
      local_a8 = GImGui;
      local_40.Min = node_00->Pos;
      local_40.Max = node_01->Pos;
      this = &node_00->Size;
      pfVar10 = ImVec2::operator[](this,idx);
      fVar2 = *pfVar10;
      pfVar10 = ImVec2::operator[](&local_40.Min,idx);
      *pfVar10 = fVar2 + *pfVar10;
      this_00 = &node_01->Size;
      pfVar10 = ImVec2::operator[](this_00,(long)(axis ^ ImGuiAxis_Y));
      fVar2 = *pfVar10;
      pfVar10 = ImVec2::operator[](&local_40.Max,(long)(axis ^ ImGuiAxis_Y));
      pIVar6 = local_a8;
      *pfVar10 = fVar2 + *pfVar10;
      uVar8 = node_01->MergedFlags | node_00->MergedFlags;
      if (((uVar8 & 0x20) == 0) &&
         ((uVar8 & (uint)(axis != ImGuiAxis_X) * 0x400000 + 0x400000) == 0)) {
        PushID(node->ID);
        pIVar6 = local_a8;
        touching_nodes[1].Size = 0;
        touching_nodes[1].Capacity = 0;
        touching_nodes[1].Data = (ImGuiDockNode **)0x0;
        touching_nodes[0].Size = 0;
        touching_nodes[0].Capacity = 0;
        touching_nodes[0].Data = (ImGuiDockNode **)0x0;
        pfVar10 = ImVec2::operator[](&(local_a8->Style).WindowMinSize,idx);
        fVar2 = *pfVar10;
        pfVar10 = ImVec2::operator[](&node->ChildNodes[0]->Pos,idx);
        fVar14 = *pfVar10 + fVar2;
        pfVar10 = ImVec2::operator[](&node->ChildNodes[1]->Pos,idx);
        fVar3 = *pfVar10;
        pfVar10 = ImVec2::operator[](&node->ChildNodes[1]->Size,idx);
        fVar4 = *pfVar10;
        IVar9 = GetID("##Splitter");
        local_b8 = (fVar3 + fVar4) - fVar2;
        if (pIVar6->ActiveId == IVar9) {
          DockNodeTreeUpdateSplitterFindTouchingNode(node_00,axis,1,touching_nodes);
          DockNodeTreeUpdateSplitterFindTouchingNode(node_01,axis,0,touching_nodes + 1);
          for (iVar13 = 0; iVar13 < touching_nodes[0].Size; iVar13 = iVar13 + 1) {
            ppIVar11 = ImVector<ImGuiDockNode_*>::operator[](touching_nodes,iVar13);
            _cur_size_0 = ImGuiDockNode::Rect(*ppIVar11);
            pfVar10 = ImVec2::operator[]((ImVec2 *)&cur_size_0,idx);
            uVar8 = -(uint)(*pfVar10 + fVar2 <= fVar14);
            fVar14 = (float)(uVar8 & (uint)fVar14 | ~uVar8 & (uint)(*pfVar10 + fVar2));
          }
          for (iVar13 = 0; iVar13 < touching_nodes[1].Size; iVar13 = iVar13 + 1) {
            ppIVar11 = ImVector<ImGuiDockNode_*>::operator[](touching_nodes + 1,iVar13);
            _cur_size_0 = ImGuiDockNode::Rect(*ppIVar11);
            pfVar10 = ImVec2::operator[](&IStack_90,idx);
            if (*pfVar10 - fVar2 <= local_b8) {
              local_b8 = *pfVar10 - fVar2;
            }
          }
        }
        pfVar10 = ImVec2::operator[](this,idx);
        cur_size_0 = *pfVar10;
        pfVar10 = ImVec2::operator[](this_00,idx);
        cur_size_1 = *pfVar10;
        pfVar10 = ImVec2::operator[](&node_00->Pos,idx);
        local_a8 = (ImGuiContext *)CONCAT44(local_a8._4_4_,*pfVar10);
        pfVar10 = ImVec2::operator[](&node_01->Pos,idx);
        fVar2 = *pfVar10;
        pfVar10 = ImVec2::operator[](this_00,idx);
        local_9c = *pfVar10;
        IVar9 = GetID("##Splitter");
        bVar7 = SplitterBehavior(&local_40,IVar9,axis,&cur_size_0,&cur_size_1,
                                 fVar14 - local_a8._0_4_,(fVar2 + local_9c) - local_b8,4.0,0.04);
        if (((bVar7) && (0 < touching_nodes[0].Size)) && (0 < touching_nodes[1].Size)) {
          fVar2 = cur_size_0;
          pfVar10 = ImVec2::operator[](&node_00->SizeRef,idx);
          *pfVar10 = fVar2;
          pfVar10 = ImVec2::operator[](this,idx);
          fVar3 = cur_size_1;
          *pfVar10 = fVar2;
          pfVar10 = ImVec2::operator[](this_00,idx);
          fVar2 = *pfVar10;
          pfVar10 = ImVec2::operator[](&node_01->Pos,idx);
          fVar4 = cur_size_1;
          *pfVar10 = *pfVar10 - (fVar3 - fVar2);
          pfVar10 = ImVec2::operator[](&node_01->SizeRef,idx);
          *pfVar10 = fVar4;
          pfVar10 = ImVec2::operator[](this_00,idx);
          *pfVar10 = fVar4;
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            for (iVar13 = 0; iVar13 < touching_nodes[lVar12].Size; iVar13 = iVar13 + 1) {
              ppIVar11 = ImVector<ImGuiDockNode_*>::operator[](touching_nodes + lVar12,iVar13);
              while( true ) {
                pIVar5 = (*ppIVar11)->ParentNode;
                if (pIVar5 == node) break;
                ppIVar11 = &(*ppIVar11)->ParentNode;
                if (pIVar5->SplitAxis == axis) {
                  puVar1 = &pIVar5->ChildNodes[lVar12]->field_0xbc;
                  *(ushort *)puVar1 = *(ushort *)puVar1 | 0x8000;
                }
              }
            }
          }
          DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,false);
          DockNodeTreeUpdatePosSize(node_01,node_01->Pos,node_01->Size,false);
          if (GImGui->SettingsDirtyTimer <= 0.0) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
        }
        PopID();
        lVar12 = 0x10;
        do {
          ImVector<ImGuiDockNode_*>::~ImVector
                    ((ImVector<ImGuiDockNode_*> *)((long)&touching_nodes[0].Size + lVar12));
          lVar12 = lVar12 + -0x10;
        } while (lVar12 != -0x10);
      }
      else {
        this_01 = local_a8->CurrentWindow->DrawList;
        col = GetColorU32(0x1b,1.0);
        ImDrawList::AddRectFilled
                  (this_01,&local_40.Min,&local_40.Max,col,(pIVar6->Style).FrameRounding,0);
      }
      if ((node_00->field_0xbd & 2) == 0) goto LAB_00147afd;
    }
    DockNodeTreeUpdateSplitter(node_00);
  }
LAB_00147afd:
  if ((node_01->field_0xbd & 2) != 0) {
    DockNodeTreeUpdateSplitter(node_01);
  }
  return;
}

Assistant:

const ImWchar* ImStrbolW(const ImWchar* buf_mid_line, const ImWchar* buf_begin) // find beginning-of-line
{
    while (buf_mid_line > buf_begin && buf_mid_line[-1] != '\n')
        buf_mid_line--;
    return buf_mid_line;
}